

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::HandleLevel4
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  _List_node_base *p_Var1;
  iterator iVar2;
  CurrentAndTwoMoreIter args;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  _List_node_base *p_Var7;
  char cVar8;
  static_string_view keyword;
  static_string_view keyword_00;
  
  p_Var1 = (newArgs->
           super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
           super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  p_Var7 = p_Var1;
  if (p_Var1 != (_List_node_base *)newArgs) {
    p_Var7 = p_Var1->_M_next;
  }
  iVar2._M_node = p_Var7;
  pcVar3 = DAT_0097a9e0;
  sVar4 = (anonymous_namespace)::keyOR;
  if (p_Var7 != (_List_node_base *)newArgs) {
    iVar2._M_node = p_Var7->_M_next;
  }
  while (iVar2._M_node != (_List_node_base *)newArgs) {
    keyword.super_string_view._M_str = DAT_0097a8e0;
    keyword.super_string_view._M_len = (anonymous_namespace)::keyAND;
    (anonymous_namespace)::keyOR = sVar4;
    DAT_0097a9e0 = pcVar3;
    bVar5 = IsKeyword(this,keyword,(cmExpandedCommandArgument *)(p_Var7 + 1));
    cVar8 = '\x01';
    if (!bVar5) {
      keyword_00.super_string_view._M_str = pcVar3;
      keyword_00.super_string_view._M_len = sVar4;
      bVar5 = IsKeyword(this,keyword_00,(cmExpandedCommandArgument *)(p_Var7 + 1));
      cVar8 = bVar5 * '\x02';
    }
    if (cVar8 != '\0') {
      bVar5 = GetBooleanValueWithAutoDereference
                        (this,(cmExpandedCommandArgument *)(p_Var1 + 1),errorString,status,false);
      bVar6 = GetBooleanValueWithAutoDereference
                        (this,(cmExpandedCommandArgument *)(iVar2._M_node + 1),errorString,status,
                         false);
      if (cVar8 == '\x01') {
        bVar5 = bVar5 && bVar6;
      }
      else {
        bVar5 = (bVar5 || bVar6) && cVar8 == '\x02';
      }
      args.next._M_node = p_Var7;
      args.current._M_node = p_Var1;
      args.nextnext._M_node = iVar2._M_node;
      cmArgumentList::ReduceTwoArgs(newArgs,bVar5,args);
    }
    p_Var1 = p_Var1->_M_next;
    p_Var7 = p_Var1;
    if (p_Var1 != (_List_node_base *)newArgs) {
      p_Var7 = p_Var1->_M_next;
    }
    iVar2._M_node = p_Var7;
    pcVar3 = DAT_0097a9e0;
    sVar4 = (anonymous_namespace)::keyOR;
    if (p_Var7 != (_List_node_base *)newArgs) {
      iVar2._M_node = p_Var7->_M_next;
    }
  }
  (anonymous_namespace)::keyOR = sVar4;
  DAT_0097a9e0 = pcVar3;
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel4(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto args = newArgs.make3ArgsIterator(); args.nextnext != newArgs.end();
       args.advance(newArgs)) {

    int matchNo;

    if ((matchNo = this->matchKeys(*args.next, keyAND, keyOR))) {
      const auto lhs = this->GetBooleanValueWithAutoDereference(
        *args.current, errorString, status);
      const auto rhs = this->GetBooleanValueWithAutoDereference(
        *args.nextnext, errorString, status);
      // clang-format off
      const auto result =
        cmRt2CtSelector<
            std::logical_and, std::logical_or
          >::eval(matchNo, lhs, rhs);
      // clang-format on
      newArgs.ReduceTwoArgs(result, args);
    }
  }
  return true;
}